

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O3

bool __thiscall QGestureManager::filterEvent(QGestureManager *this,QWidget *receiver,QEvent *event)

{
  long lVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  QWidget *pQVar4;
  long lVar5;
  _Rb_tree_node_base *p_Var6;
  long in_FS_OFFSET;
  undefined8 local_a0;
  QMultiMap<QObject_*,_Qt::GestureType> local_98;
  QVLABase<Qt::GestureType> local_90;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_90.super_QVLABaseBase.ptr = &local_78;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_90.super_QVLABaseBase.a = 0x10;
  local_90.super_QVLABaseBase.s = 0;
  local_98.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::multimap<QObject_*,_Qt::GestureType,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_Qt::GestureType>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::multimap<QObject_*,_Qt::GestureType,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_Qt::GestureType>_>_>_>_*>
          )0x0;
  lVar5 = *(long *)(*(long *)&receiver->field_0x8 + 0x238);
  if ((lVar5 != 0) && (*(long *)(lVar5 + 0x30) != 0)) {
    p_Var3 = *(_Rb_tree_node_base **)(lVar5 + 0x20);
    if (p_Var3 != (_Rb_tree_node_base *)(lVar5 + 0x10)) {
      do {
        p_Var6 = p_Var3 + 1;
        if (local_90.super_QVLABaseBase.s == local_90.super_QVLABaseBase.a) {
          local_a0 = (QWidget *)CONCAT44(local_a0._4_4_,p_Var6->_M_color);
          QVLABase<Qt::GestureType>::emplace_back_impl<Qt::GestureType>
                    (&local_90,0x10,&local_78,(GestureType *)&local_a0);
        }
        else {
          QVLABase<Qt::GestureType>::emplace_back_impl<Qt::GestureType_const&>
                    (&local_90,0x10,&local_78,&p_Var6->_M_color);
        }
        local_a0 = receiver;
        QMultiMap<QObject_*,_Qt::GestureType>::insert
                  (&local_98,(QObject **)&local_a0,&p_Var6->_M_color);
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      } while (p_Var3 != (_Rb_tree_node_base *)(lVar5 + 0x10));
    }
  }
  if ((((receiver->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
     (pQVar4 = *(QWidget **)(*(long *)&receiver->field_0x8 + 0x10), pQVar4 != (QWidget *)0x0)) {
    do {
      lVar5 = *(long *)(*(long *)&pQVar4->field_0x8 + 0x238);
      if (lVar5 == 0) {
        p_Var3 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var3 = *(_Rb_tree_node_base **)(lVar5 + 0x20);
      }
      p_Var6 = (_Rb_tree_node_base *)(lVar5 + 0x10);
      if (lVar5 == 0) {
        p_Var6 = (_Rb_tree_node_base *)0x0;
      }
      for (; p_Var3 != p_Var6; p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        if ((p_Var3[1].field_0x4 & 1) == 0) {
          lVar5 = local_90.super_QVLABaseBase.s * 4;
          do {
            if (lVar5 == 0) {
              if (local_90.super_QVLABaseBase.s == local_90.super_QVLABaseBase.a) {
                local_a0._4_4_ = (undefined4)((ulong)local_a0 >> 0x20);
                local_a0 = (QWidget *)CONCAT44(local_a0._4_4_,p_Var3[1]._M_color);
                QVLABase<Qt::GestureType>::emplace_back_impl<Qt::GestureType>
                          (&local_90,0x10,&local_78,(GestureType *)&local_a0);
              }
              else {
                QVLABase<Qt::GestureType>::emplace_back_impl<Qt::GestureType_const&>
                          (&local_90,0x10,&local_78,&p_Var3[1]._M_color);
              }
              local_a0 = pQVar4;
              QMultiMap<QObject_*,_Qt::GestureType>::insert
                        (&local_98,(QObject **)&local_a0,&p_Var3[1]._M_color);
              break;
            }
            lVar1 = lVar5 + -4;
            lVar5 = lVar5 + -4;
          } while (*(_Rb_tree_color *)((long)local_90.super_QVLABaseBase.ptr + lVar1) !=
                   p_Var3[1]._M_color);
        }
      }
    } while ((((pQVar4->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
               super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
            (pQVar4 = *(QWidget **)(*(long *)&pQVar4->field_0x8 + 0x10), pQVar4 != (QWidget *)0x0));
  }
  if ((local_98.d.d.ptr ==
       (totally_ordered_wrapper<QMapData<std::multimap<QObject_*,_Qt::GestureType,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_Qt::GestureType>_>_>_>_*>
        )0x0) || (*(size_t *)((long)local_98.d.d.ptr + 0x30) == 0)) {
    bVar2 = false;
  }
  else {
    bVar2 = filterEventThroughContexts(this,&local_98,event);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QObject_*,_Qt::GestureType,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_Qt::GestureType>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_98.d);
  if ((undefined1 **)local_90.super_QVLABaseBase.ptr != &local_78) {
    QtPrivate::sizedFree(local_90.super_QVLABaseBase.ptr,local_90.super_QVLABaseBase.a << 2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QGestureManager::filterEvent(QWidget *receiver, QEvent *event)
{
    QVarLengthArray<Qt::GestureType, 16> types;
    QMultiMap<QObject *, Qt::GestureType> contexts;
    QWidget *w = receiver;
    typedef QMap<Qt::GestureType, Qt::GestureFlags>::const_iterator ContextIterator;
    if (!w->d_func()->gestureContext.isEmpty()) {
        for(ContextIterator it = w->d_func()->gestureContext.constBegin(),
            e = w->d_func()->gestureContext.constEnd(); it != e; ++it) {
            types.push_back(it.key());
            contexts.insert(w, it.key());
        }
    }
    // find all gesture contexts for the widget tree
    w = w->isWindow() ? nullptr : w->parentWidget();
    while (w)
    {
        for (ContextIterator it = w->d_func()->gestureContext.constBegin(),
             e = w->d_func()->gestureContext.constEnd(); it != e; ++it) {
            if (!(it.value() & Qt::DontStartGestureOnChildren)) {
                if (!types.contains(it.key())) {
                    types.push_back(it.key());
                    contexts.insert(w, it.key());
                }
            }
        }
        if (w->isWindow())
            break;
        w = w->parentWidget();
    }
    return contexts.isEmpty() ? false : filterEventThroughContexts(contexts, event);
}